

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterInvocationTestCase::deinit
          (InterInvocationTestCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (this->m_storageBuf != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_storageBuf);
    this->m_storageBuf = 0;
  }
  if (this->m_storageTex != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x480))(1,&this->m_storageTex);
    this->m_storageTex = 0;
  }
  if (this->m_resultBuf != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x438))(1,&this->m_resultBuf);
    this->m_resultBuf = 0;
  }
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

void InterInvocationTestCase::deinit (void)
{
	if (m_storageBuf)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_storageBuf);
		m_storageBuf = DE_NULL;
	}

	if (m_storageTex)
	{
		m_context.getRenderContext().getFunctions().deleteTextures(1, &m_storageTex);
		m_storageTex = DE_NULL;
	}

	if (m_resultBuf)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_resultBuf);
		m_resultBuf = DE_NULL;
	}

	delete m_program;
	m_program = DE_NULL;
}